

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_file.cpp
# Opt level: O0

file_handle __thiscall
libtorrent::aux::part_file::open_file(part_file *this,open_mode_t mode,error_code *ec)

{
  undefined4 in_register_00000034;
  char *in_R9;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  string_view sVar3;
  string_view rhs;
  storage_error *e;
  storage_error *e_1;
  undefined1 local_48 [8];
  string fn;
  error_code *ec_local;
  part_file *this_local;
  open_mode_t mode_local;
  
  auVar1 = ::std::__cxx11::string::operator_cast_to_basic_string_view
                     ((string *)CONCAT44(in_register_00000034,mode.m_val));
  sVar3._M_len = auVar1._8_8_;
  auVar2 = ::std::__cxx11::string::operator_cast_to_basic_string_view
                     ((string *)CONCAT44(in_register_00000034,mode.m_val) + 0x20);
  sVar3._M_str = auVar2._0_8_;
  rhs._M_str = in_R9;
  rhs._M_len = auVar2._8_8_;
  combine_path_abi_cxx11_((string *)local_48,auVar1._0_8_,sVar3,rhs);
  sVar3 = (string_view)
          ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_48);
  file_handle::file_handle((file_handle *)this,sVar3,0,(open_mode_t)(uint)ec);
  ::std::__cxx11::string::~string((string *)local_48);
  return (file_handle)(handle_type)this;
}

Assistant:

aux::file_handle part_file::open_file(aux::open_mode_t const mode, error_code& ec) try
	{
		std::string const fn = combine_path(m_path, m_name);
		try {
			return aux::file_handle(fn, 0, mode);
		}
		catch (storage_error const& e)
		{
			if ((mode & aux::open_mode::write)
				&& e.ec == boost::system::errc::no_such_file_or_directory)
			{
				// this means the directory the file is in doesn't exist.
				// so create it
				ec.clear();
				create_directories(m_path, ec);
				if (ec) return {};
				return aux::file_handle(fn, 0, mode);
			}
			return {};
		}
	}
	catch (storage_error const& e)
	{
		ec = e.ec;
		return {};
	}